

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindLValue
          (ExpressionSyntax *syntax,ASTContext *context,bitmask<slang::ast::AssignFlags> assignFlags
          )

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  sockaddr *in_RSI;
  Compilation *in_RDI;
  Expression *expr;
  Expression *in_stack_000000f8;
  ASTContext *in_stack_00000100;
  Expression *in_stack_00000108;
  bitmask<slang::ast::AssignFlags> in_stack_00000117;
  SourceLocation in_stack_00000118;
  Expression *in_stack_ffffffffffffff98;
  SourceLocation local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  Expression *local_28;
  Expression *local_8;
  
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,LValue);
  iVar2 = bind((int)in_RDI,in_RSI,(socklen_t)local_30.m_bits);
  local_28 = (Expression *)CONCAT44(extraout_var,iVar2);
  SourceLocation::SourceLocation(&local_38);
  bVar1 = requireLValue(in_stack_00000108,in_stack_00000100,in_stack_00000118,in_stack_00000117,
                        in_stack_000000f8);
  if (bVar1) {
    local_8 = local_28;
  }
  else {
    ASTContext::getCompilation((ASTContext *)0x60cbe2);
    local_8 = badExpr(in_RDI,in_stack_ffffffffffffff98);
  }
  return local_8;
}

Assistant:

const Expression& Expression::bindLValue(const ExpressionSyntax& syntax, const ASTContext& context,
                                         bitmask<AssignFlags> assignFlags) {
    auto& expr = bind(syntax, context, ASTFlags::LValue);
    if (!expr.requireLValue(context, {}, assignFlags))
        return badExpr(context.getCompilation(), &expr);
    return expr;
}